

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::moveRegToStackArg
          (RACFGBuilder *this,InvokeNode *invokeNode,FuncValue *arg,BaseReg *reg)

{
  bool bVar1;
  Error EVar2;
  Environment in_RCX;
  uint *in_RDX;
  long *in_RDI;
  Error _err_6;
  Error _err_5;
  Error _err_4;
  Error _err_3;
  Error _err_2;
  Error _err_1;
  Error _err;
  uint32_t vMovInstId;
  bool isSrcSigned_1;
  bool isDstSigned_1;
  bool isSrcSigned;
  bool isDstSigned;
  TypeId srcTypeId;
  TypeId dstTypeId;
  InstId instId;
  uint32_t registerSize;
  VirtReg *vr;
  Reg r1;
  Reg r0;
  Mem stackPtr;
  undefined4 in_stack_ffffffffffffee48;
  uint32_t in_stack_ffffffffffffee4c;
  undefined4 in_stack_ffffffffffffee50;
  undefined4 in_stack_ffffffffffffee54;
  undefined8 in_stack_ffffffffffffee58;
  InstId instId_00;
  BaseEmitter *in_stack_ffffffffffffee60;
  undefined4 local_1194;
  undefined4 local_117c;
  undefined4 local_1164;
  bool local_10e6;
  bool local_10e5;
  undefined4 local_10e4;
  bool local_10d4;
  bool local_10d3;
  bool local_10d1;
  bool local_10d0;
  bool local_10cf;
  bool local_10cd;
  bool local_10cc;
  bool local_10cb;
  bool local_10ca;
  bool local_10c9;
  bool local_10c7;
  bool local_10c6;
  bool local_10c3;
  bool local_10c2;
  bool local_10c1;
  bool local_10c0;
  bool local_10bf;
  bool local_10be;
  bool local_10bb;
  bool local_10b9;
  undefined4 local_10a4 [2];
  Error local_109c;
  undefined4 local_1098;
  Error local_1090;
  Error local_1088;
  undefined4 local_1084;
  bool local_107e;
  bool local_107d;
  bool local_107c;
  bool local_107b;
  VirtReg local_107a;
  byte local_1079;
  undefined4 local_1078;
  int local_1074;
  VirtReg *local_1070;
  undefined4 local_1068;
  uint local_1064;
  undefined4 local_1060;
  undefined4 local_105c;
  undefined4 local_1058;
  uint local_1054;
  undefined4 local_1050;
  undefined4 local_104c;
  undefined1 local_1048 [24];
  uint *local_1030;
  undefined1 local_1028 [24];
  Environment local_1010;
  Environment local_1008;
  Environment local_1000;
  Environment local_ff8;
  Environment local_ff0;
  Environment local_fe8;
  Environment local_fe0;
  Environment local_fd8;
  Environment local_fd0;
  Environment local_fc8;
  Environment local_fc0;
  Environment local_fb8;
  Environment local_fb0;
  Environment local_fa8;
  Environment local_fa0;
  Environment local_f98;
  Environment local_f90;
  Environment local_f88;
  Environment local_f80;
  Environment local_f78;
  Environment local_f70;
  Environment local_f68;
  uint *local_ee0;
  undefined4 local_ed4;
  BaseEmitter *local_ed0;
  undefined4 local_ec4;
  undefined1 *local_ec0;
  undefined4 local_eb4;
  undefined1 *local_eb0;
  undefined4 local_ea4;
  undefined1 *local_ea0;
  undefined4 local_e94;
  undefined1 *local_e90;
  undefined4 local_e84;
  undefined1 *local_e80;
  undefined4 local_e74;
  undefined1 *local_e70;
  undefined4 local_e64;
  undefined1 *local_e60;
  undefined4 local_e54;
  undefined1 *local_e50;
  undefined4 local_e44;
  undefined1 *local_e40;
  uint local_e34;
  undefined1 *local_e30;
  undefined4 local_e28;
  undefined4 local_e24;
  undefined4 local_e18;
  undefined4 local_e14;
  undefined4 local_e08;
  undefined4 local_e04;
  undefined4 local_df8;
  undefined4 local_df4;
  undefined4 local_de8;
  undefined4 local_de4;
  undefined1 *local_dd8;
  byte local_dcd;
  undefined4 local_dcc;
  undefined4 local_dc8;
  ValidationFlags local_dc4;
  char *in_stack_fffffffffffff240;
  undefined8 in_stack_fffffffffffff248;
  int line;
  char *in_stack_fffffffffffff250;
  undefined4 local_d84;
  undefined4 *local_d80;
  undefined4 local_d74;
  undefined4 *local_d70;
  long local_d68;
  VirtReg *local_d60;
  VirtReg local_d53;
  VirtReg local_d52;
  VirtReg local_d51;
  undefined4 local_d50;
  uint local_d4c;
  undefined4 *local_d48;
  undefined4 local_d40;
  uint local_d3c;
  undefined4 *local_d38;
  undefined4 local_d30;
  uint local_d2c;
  undefined4 *local_d28;
  VirtReg local_d1b;
  VirtReg local_d1a;
  VirtReg local_d19;
  undefined4 local_d18;
  uint local_d14;
  undefined4 *local_d10;
  undefined4 local_d08;
  uint local_d04;
  undefined4 *local_d00;
  undefined4 local_cf8;
  uint local_cf4;
  undefined4 *local_cf0;
  VirtReg local_ce2;
  VirtReg local_ce1;
  undefined4 local_ce0;
  uint local_cdc;
  undefined4 *local_cd8;
  undefined4 local_cd0;
  uint local_ccc;
  undefined4 *local_cc8;
  undefined4 local_cc0;
  uint local_cbc;
  undefined4 *local_cb8;
  undefined4 local_cb0;
  uint local_cac;
  undefined4 *local_ca8;
  undefined4 local_ca0;
  uint local_c9c;
  undefined4 *local_c98;
  VirtReg local_c8c;
  VirtReg local_c8b;
  VirtReg local_c8a;
  VirtReg local_c89;
  VirtReg local_c88;
  byte local_c87;
  VirtReg local_c86;
  VirtReg local_c85;
  VirtReg local_c84;
  VirtReg local_c83;
  VirtReg local_c82;
  VirtReg local_c81;
  Environment local_c80;
  byte local_c71;
  undefined4 local_c70;
  uint local_c6c;
  undefined4 *local_c68;
  undefined4 local_c60;
  uint local_c5c;
  undefined4 *local_c58;
  undefined4 local_c50;
  uint local_c4c;
  undefined4 *local_c48;
  byte local_c39;
  undefined4 local_c38;
  uint local_c34;
  undefined4 *local_c30;
  byte local_c21;
  undefined4 local_c20;
  uint local_c1c;
  undefined4 *local_c18;
  undefined4 *local_c10;
  undefined1 *local_c08;
  undefined4 local_bfc;
  long local_bf8;
  undefined4 *local_bf0;
  undefined1 *local_be8;
  undefined4 local_bdc;
  long local_bd8;
  undefined4 *local_bd0;
  undefined1 *local_bc8;
  undefined4 local_bbc;
  long local_bb8;
  undefined4 *local_bb0;
  undefined1 *local_ba8;
  undefined4 local_b9c;
  long local_b98;
  undefined4 *local_b90;
  undefined1 *local_b88;
  undefined4 local_b7c;
  long local_b78;
  undefined4 *local_b70;
  undefined1 *local_b68;
  undefined4 local_b5c;
  long local_b58;
  undefined4 *local_b50;
  undefined1 *local_b48;
  undefined4 local_b3c;
  long local_b38;
  undefined4 *local_b30;
  undefined1 *local_b28;
  undefined4 local_b1c;
  long local_b18;
  undefined4 *local_b10;
  undefined1 *local_b08;
  undefined4 local_afc;
  long local_af8;
  undefined4 *local_af0;
  undefined1 *local_ae8;
  undefined4 local_adc;
  long local_ad8;
  undefined4 *local_ad0;
  undefined4 *local_ac8;
  undefined4 local_abc;
  long local_ab8;
  undefined4 *local_ab0;
  undefined4 *local_aa8;
  undefined4 local_a9c;
  long local_a98;
  undefined4 *local_a90;
  undefined4 *local_a88;
  undefined4 local_a7c;
  long local_a78;
  undefined4 local_a70;
  uint local_a6c;
  undefined4 *local_a68;
  undefined4 local_a60;
  uint local_a5c;
  undefined4 *local_a58;
  undefined4 local_a50;
  undefined4 local_a4c;
  undefined4 local_a48;
  undefined4 local_a44;
  undefined4 *local_a40;
  undefined1 *local_a38;
  undefined4 local_a2c;
  long local_a28;
  undefined4 local_a20;
  uint local_a1c;
  undefined4 *local_a18;
  undefined4 local_a10;
  uint local_a0c;
  undefined4 *local_a08;
  undefined4 local_9fc;
  undefined4 *local_9f8;
  undefined4 *local_9f0;
  undefined4 local_9e4;
  undefined4 *local_9e0;
  undefined4 *local_9d8;
  undefined4 local_9cc;
  undefined4 local_9bc;
  uint local_9b8;
  undefined1 local_9b1;
  Environment local_9b0;
  undefined4 local_9a4;
  Environment local_9a0;
  uint local_994;
  undefined4 *local_990;
  uint *local_988;
  undefined1 local_979;
  undefined4 local_978;
  undefined4 local_974;
  undefined4 local_970;
  undefined4 local_96c;
  undefined4 *local_968;
  undefined4 *local_960;
  undefined4 local_954;
  undefined4 local_950;
  undefined4 local_94c;
  undefined4 *local_948;
  undefined4 *local_940;
  uint local_934;
  undefined1 *local_930;
  undefined4 local_924;
  undefined1 *local_920;
  undefined4 local_914;
  undefined1 *local_910;
  undefined4 local_904;
  undefined1 *local_900;
  undefined4 local_8f4;
  undefined1 *local_8f0;
  undefined4 local_8e4;
  undefined1 *local_8e0;
  undefined4 local_8d4;
  undefined1 *local_8d0;
  undefined4 local_8c4;
  undefined1 *local_8c0;
  undefined4 local_8b4;
  undefined1 *local_8b0;
  undefined4 local_8a4;
  undefined1 *local_8a0;
  undefined4 local_894;
  BaseEmitter *local_890;
  undefined4 local_888;
  uint local_884 [3];
  uint local_878;
  uint local_874 [2];
  ValidationFlags local_86c;
  byte *local_868;
  undefined1 *local_860;
  undefined4 local_854;
  byte *local_850;
  byte *local_848;
  byte *local_840;
  byte local_835;
  uint local_834;
  byte *local_830;
  undefined4 local_828;
  undefined4 local_824;
  undefined4 *local_820;
  uint *local_818;
  uint local_80c;
  undefined4 *local_808;
  uint *local_800;
  uint local_7f4;
  uint *local_7f0;
  uint *local_7e8;
  uint local_7dc;
  undefined4 local_7d8;
  undefined4 local_7d4;
  long local_7d0;
  byte *local_7c8;
  byte local_7ba;
  byte local_7b9;
  undefined4 local_7b8;
  undefined4 local_7b4;
  uint local_7b0;
  undefined1 local_7ab;
  undefined1 local_7aa;
  byte local_7a9;
  undefined4 local_7a8;
  undefined4 local_7a4;
  uint local_7a0;
  undefined1 local_79b;
  undefined1 local_79a;
  byte local_799;
  undefined4 local_798;
  undefined4 local_794;
  uint local_790;
  undefined1 local_78b;
  undefined1 local_78a;
  byte local_789;
  undefined4 local_788;
  undefined4 local_784;
  uint local_780;
  undefined1 local_77b;
  undefined1 local_77a;
  VirtReg local_779;
  undefined4 local_778;
  undefined4 local_774;
  uint local_770;
  undefined1 local_76b;
  undefined1 local_76a;
  VirtReg local_769;
  undefined4 local_768;
  undefined4 local_764;
  uint local_760;
  undefined1 local_75b;
  undefined1 local_75a;
  VirtReg local_759;
  undefined4 local_758;
  undefined4 local_754;
  uint local_750;
  undefined1 local_74b;
  undefined1 local_74a;
  VirtReg local_749;
  undefined4 local_748;
  undefined4 local_744;
  uint local_740;
  undefined1 local_73b;
  undefined1 local_73a;
  VirtReg local_739;
  undefined4 local_738;
  undefined4 local_734;
  uint local_730;
  undefined1 local_72b;
  undefined1 local_72a;
  VirtReg local_729;
  undefined4 local_728;
  undefined4 local_724;
  uint local_720;
  undefined1 local_71b;
  undefined1 local_71a;
  byte local_719;
  undefined4 local_718;
  undefined4 local_714;
  uint local_710;
  undefined1 local_70b;
  undefined1 local_70a;
  VirtReg local_709;
  undefined4 local_708;
  undefined4 local_704;
  uint local_700;
  undefined1 local_6fb;
  undefined1 local_6fa;
  VirtReg local_6f9;
  undefined4 local_6f8;
  undefined4 local_6f4;
  uint local_6f0;
  undefined1 local_6eb;
  undefined1 local_6ea;
  VirtReg local_6e9;
  undefined4 local_6e8;
  undefined4 local_6e4;
  uint local_6e0;
  undefined1 local_6db;
  undefined1 local_6da;
  VirtReg local_6d9;
  undefined4 local_6d8;
  undefined4 local_6d4;
  uint local_6d0;
  undefined1 local_6cb;
  undefined1 local_6ca;
  VirtReg local_6c9;
  undefined4 local_6c8;
  undefined4 local_6c4;
  uint local_6c0;
  undefined1 local_6bb;
  undefined1 local_6ba;
  VirtReg local_6b9;
  undefined4 local_6b8;
  undefined4 local_6b4;
  uint local_6b0;
  undefined1 local_6ab;
  undefined1 local_6aa;
  VirtReg local_6a9;
  undefined4 local_6a8;
  undefined4 local_6a4;
  uint local_6a0;
  undefined1 local_69b;
  undefined1 local_69a;
  VirtReg local_699;
  undefined4 local_698;
  undefined4 local_694;
  uint local_690;
  undefined1 local_68b;
  undefined1 local_68a;
  VirtReg local_689;
  undefined4 local_688;
  undefined4 local_684;
  uint local_680;
  undefined1 local_67b;
  undefined1 local_67a;
  VirtReg local_679;
  undefined4 local_678;
  undefined4 local_674;
  uint local_670;
  undefined1 local_66b;
  undefined1 local_66a;
  VirtReg local_669;
  undefined4 local_668;
  undefined4 local_664;
  uint local_660;
  undefined1 local_65b;
  undefined1 local_65a;
  VirtReg local_659;
  undefined4 local_658;
  undefined4 local_654;
  uint local_650;
  undefined1 local_64b;
  undefined1 local_64a;
  VirtReg local_649;
  undefined4 *local_648;
  undefined4 *local_640;
  uint *local_638;
  undefined4 *local_630;
  undefined4 *local_628;
  uint *local_620;
  undefined4 *local_618;
  undefined4 *local_610;
  uint *local_608;
  undefined4 *local_600;
  undefined4 *local_5f8;
  uint *local_5f0;
  undefined4 *local_5e8;
  undefined4 *local_5e0;
  uint *local_5d8;
  undefined4 *local_5d0;
  undefined4 *local_5c8;
  uint *local_5c0;
  undefined4 *local_5b8;
  undefined4 *local_5b0;
  uint *local_5a8;
  undefined4 *local_5a0;
  undefined4 *local_598;
  uint *local_590;
  undefined4 *local_588;
  undefined4 *local_580;
  uint *local_578;
  undefined4 *local_570;
  undefined4 *local_568;
  uint *local_560;
  undefined4 *local_558;
  undefined4 *local_550;
  uint *local_548;
  undefined4 *local_540;
  undefined4 *local_538;
  uint *local_530;
  undefined4 *local_528;
  undefined4 *local_520;
  uint *local_518;
  undefined4 *local_510;
  undefined4 *local_508;
  uint *local_500;
  undefined4 *local_4f8;
  undefined4 *local_4f0;
  uint *local_4e8;
  undefined4 *local_4e0;
  undefined4 *local_4d8;
  uint *local_4d0;
  undefined4 *local_4c8;
  undefined4 *local_4c0;
  uint *local_4b8;
  undefined4 *local_4b0;
  undefined4 *local_4a8;
  uint *local_4a0;
  undefined4 *local_498;
  undefined4 *local_490;
  uint *local_488;
  undefined4 *local_480;
  undefined4 *local_478;
  uint *local_470;
  undefined4 *local_468;
  undefined4 *local_460;
  uint *local_458;
  undefined4 *local_450;
  undefined4 *local_448;
  uint *local_440;
  undefined4 *local_438;
  undefined4 *local_430;
  uint *local_428;
  ValidationFlags local_41c;
  undefined4 local_418;
  undefined4 local_414;
  uint *local_410;
  undefined1 *local_408;
  ValidationFlags local_3fc;
  undefined4 local_3f8;
  undefined4 local_3f4;
  uint *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  undefined4 *local_388;
  undefined4 *local_380;
  undefined4 *local_378;
  undefined4 *local_370;
  undefined4 *local_368;
  undefined4 *local_360;
  undefined4 *local_358;
  undefined4 *local_350;
  undefined4 *local_348;
  undefined4 *local_340;
  undefined4 *local_338;
  undefined4 *local_330;
  undefined4 *local_328;
  undefined4 *local_320;
  undefined4 *local_318;
  undefined4 *local_310;
  undefined4 *local_308;
  undefined4 *local_300;
  undefined4 *local_2f8;
  undefined4 *local_2f0;
  undefined4 *local_2e8;
  undefined4 *local_2e0;
  undefined4 *local_2d8;
  undefined4 *local_2d0;
  undefined4 *local_2c8;
  undefined4 *local_2c0;
  undefined4 *local_2b8;
  undefined4 *local_2b0;
  undefined4 *local_2a8;
  undefined4 *local_2a0;
  undefined4 *local_298;
  undefined4 *local_290;
  undefined4 *local_288;
  undefined4 *local_280;
  undefined4 *local_278;
  undefined4 *local_270;
  undefined4 *local_268;
  undefined4 *local_260;
  undefined4 *local_258;
  undefined4 *local_250;
  uint local_244;
  undefined4 *local_240;
  uint local_234;
  undefined4 *local_230;
  uint local_224;
  undefined4 *local_220;
  uint local_214;
  undefined4 *local_210;
  uint local_204;
  undefined4 *local_200;
  uint local_1f4;
  undefined4 *local_1f0;
  uint local_1e4;
  undefined4 *local_1e0;
  uint local_1d4;
  undefined4 *local_1d0;
  uint local_1c4;
  undefined4 *local_1c0;
  uint local_1b4;
  undefined4 *local_1b0;
  uint local_1a4;
  undefined4 *local_1a0;
  uint local_194;
  undefined4 *local_190;
  uint local_184;
  undefined4 *local_180;
  uint local_174;
  undefined4 *local_170;
  uint local_164;
  undefined4 *local_160;
  uint local_154;
  undefined4 *local_150;
  uint local_144;
  undefined4 *local_140;
  uint local_134;
  undefined4 *local_130;
  uint local_124;
  undefined4 *local_120;
  uint local_114;
  undefined4 *local_110;
  undefined4 *local_108;
  undefined4 *local_100;
  undefined4 *local_f8;
  undefined4 *local_f0;
  undefined4 *local_e8;
  undefined4 *local_e0;
  undefined4 *local_d8;
  undefined4 *local_d0;
  undefined4 *local_c8;
  undefined4 *local_c0;
  undefined4 *local_b8;
  undefined4 *local_b0;
  undefined4 *local_a8;
  undefined4 *local_a0;
  undefined4 *local_98;
  undefined4 *local_90;
  undefined4 *local_88;
  undefined4 *local_80;
  undefined4 local_78;
  undefined4 local_74;
  undefined4 local_70;
  undefined4 local_6c;
  undefined4 *local_68;
  undefined4 *local_60;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 *local_40;
  undefined4 *local_38;
  undefined4 *local_30;
  undefined4 *local_28;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined8 local_10;
  undefined8 local_8;
  
  instId_00 = (InstId)((ulong)in_stack_ffffffffffffee58 >> 0x20);
  line = (int)((ulong)in_stack_fffffffffffff248 >> 0x20);
  local_dd8 = local_1028;
  local_9cc = 0x200;
  local_1048._16_8_ = in_RCX;
  local_1030 = in_RDX;
  bVar1 = Support::test<unsigned_int,unsigned_int>(*in_RDX,0x200);
  if (!bVar1) {
    DebugUtils::assertionFailed(in_stack_fffffffffffff250,line,in_stack_fffffffffffff240);
  }
  local_868 = (byte *)(*in_RDI + 0x1d8);
  local_dc4 = (int)*local_1030 >> 0xc;
  local_860 = local_1048;
  local_dc8 = 0;
  local_dcc = 0;
  local_854 = 0;
  local_874[1] = 0;
  local_828 = 2;
  local_824 = 2;
  local_884[1] = 2;
  local_835 = *local_868 >> 3;
  local_884[0] = (uint)local_835 << 3;
  local_7e8 = local_884 + 1;
  local_7f0 = local_884;
  local_884[2] = local_884[0] | 2;
  local_7d8 = 0;
  local_888 = 0;
  local_800 = local_884 + 2;
  local_808 = &local_888;
  local_818 = &local_878;
  local_820 = &local_854;
  local_414 = *(undefined4 *)(*in_RDI + 0x1dc);
  local_410 = local_874;
  local_418 = 0;
  local_3f8 = 0;
  local_1048[8] = kNone;
  local_1048[9] = kNone;
  local_1048[10] = '\0';
  local_1048[0xb] = '\0';
  local_d80 = &local_1058;
  local_d84 = 1;
  local_9e0 = &local_d84;
  local_9e4 = 0xff;
  local_96c = 0xff;
  local_970 = 0;
  local_974 = 0;
  local_1058 = 1;
  local_1054 = 0xff;
  local_1050 = 0;
  local_104c = 0;
  local_d70 = &local_1068;
  local_d74 = 1;
  local_9f8 = &local_d74;
  local_9fc = 0xff;
  local_94c = 0xff;
  local_950 = 0;
  local_954 = 0;
  local_1068 = 1;
  local_1064 = 0xff;
  local_1060 = 0;
  local_105c = 0;
  local_f68._arch = local_1048[0x10];
  local_f68._subArch = local_1048[0x11];
  local_f68._vendor = local_1048[0x12];
  local_f68._platform = local_1048[0x13];
  local_f68._platformABI = local_1048[0x14];
  local_f68._objectFormat = local_1048[0x15];
  local_f68._floatABI = local_1048[0x16];
  local_f68._reserved = local_1048[0x17];
  local_9f0 = local_d70;
  local_9d8 = local_d80;
  local_968 = local_9e0;
  local_960 = local_d80;
  local_948 = local_9f8;
  local_940 = local_d70;
  local_878 = local_884[2];
  local_874[0] = local_884[2];
  local_86c = local_dc4;
  local_850 = local_868;
  local_848 = local_868;
  local_840 = local_868;
  local_834 = local_884[0];
  local_830 = local_868;
  local_80c = local_884[2];
  local_7f4 = local_884[2];
  local_7dc = local_884[2];
  local_7d4 = local_888;
  local_41c = local_dc4;
  local_408 = local_860;
  local_3fc = local_dc4;
  local_3f4 = local_414;
  local_3f0 = local_410;
  local_3e8 = local_860;
  local_1048._0_4_ = local_884[2];
  local_1048._4_4_ = local_414;
  local_1048._12_4_ = local_dc4;
  local_1070 = BaseCompiler::virtRegById
                         ((BaseCompiler *)
                          CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                          in_stack_ffffffffffffee4c);
  local_d68 = in_RDI[1];
  local_7c8 = (byte *)(local_d68 + 0x48);
  local_7ba = *local_7c8;
  local_1074 = ((byte)~local_7ba & 1) * 4 + 4;
  local_1078 = 0;
  local_ee0 = local_1030;
  local_1079 = (byte)*local_1030;
  local_107a = local_1070[0xd];
  local_d60 = local_1070;
  local_7d0 = local_d68;
  local_7b9 = local_7ba;
  switch(local_1079) {
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    local_68a = 0x24;
    local_68b = 0x25;
    local_690 = (uint)(byte)local_107a;
    local_694 = 0x24;
    local_698 = 0x25;
    local_5d8 = &local_690;
    local_5e0 = &local_694;
    local_5e8 = &local_698;
    local_10c1 = 0x23 < local_690 && local_690 < 0x26;
    local_d1a = local_107a;
    local_689 = local_107a;
    if (local_10c1) {
      local_10c2 = local_1079 == 0x24 || local_1079 == 0x26;
      local_107b = local_10c2;
      local_10c3 = local_107a == (VirtReg)0x22 || local_107a == (VirtReg)0x24;
      local_107c = local_10c3;
      local_f88._arch = local_1048[0x10];
      local_f88._subArch = local_1048[0x11];
      local_f88._vendor = local_1048[0x12];
      local_f88._platform = local_1048[0x13];
      local_f88._platformABI = local_1048[0x14];
      local_f88._objectFormat = local_1048[0x15];
      local_f88._floatABI = local_1048[0x16];
      local_f88._reserved = local_1048[0x17];
      local_d04 = *(uint *)(local_1048._16_8_ + 4);
      local_d00 = &local_1068;
      local_d08 = 0x2000029;
      local_298 = &local_d08;
      local_1068 = 0x2000029;
      bVar1 = false;
      if (local_10c2) {
        bVar1 = local_10c3;
      }
      local_1078 = 0x1de;
      local_290 = local_d00;
      local_154 = local_d04;
      local_150 = local_d00;
      local_1064 = local_d04;
      if (bVar1) {
        local_1078 = 0x1da;
      }
LAB_001f1451:
      local_e40 = local_1048;
      local_e44 = 4;
      local_924 = 4;
      local_1048._0_4_ = local_1048._0_4_ & 0xffffff | 0x4000000;
      local_fc0._arch = local_1048[0x10];
      local_fc0._subArch = local_1048[0x11];
      local_fc0._vendor = local_1048[0x12];
      local_fc0._platform = local_1048[0x13];
      local_fc0._platformABI = local_1048[0x14];
      local_fc0._objectFormat = local_1048[0x15];
      local_fc0._floatABI = local_1048[0x16];
      local_fc0._reserved = local_1048[0x17];
      local_cac = *(uint *)(local_1048._16_8_ + 4);
      local_ca8 = &local_1058;
      local_cb0 = 0x4000031;
      local_2e8 = &local_cb0;
      local_1058 = 0x4000031;
      local_a78 = in_RDI[1];
      local_a7c = local_1078;
      local_a88 = &local_1058;
      local_a90 = &local_1068;
      local_920 = local_e40;
      local_2e0 = local_ca8;
      local_1a4 = local_cac;
      local_1a0 = local_ca8;
      local_108 = local_a90;
      local_100 = local_a88;
      local_1054 = local_cac;
      local_1088 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                       (Operand_ *)
                                       CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50)
                                       ,(Operand_ *)
                                        CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48
                                                ));
      if (local_1088 != 0) {
        return local_1088;
      }
      local_af8 = in_RDI[1];
      local_afc = 0x1b7;
      local_b08 = local_1048;
      local_b10 = &local_1058;
      local_3d0 = local_b08;
      local_d0 = local_b10;
      EVar2 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
      if (EVar2 != 0) {
        return EVar2;
      }
      return 0;
    }
    local_65a = 0x22;
    local_65b = 0x23;
    local_660 = (uint)(byte)local_107a;
    local_664 = 0x22;
    local_668 = 0x23;
    local_620 = &local_660;
    local_628 = &local_664;
    local_630 = &local_668;
    local_d52 = local_107a;
    local_659 = local_107a;
    if (0x21 < local_660 && local_660 < 0x24) {
      local_10c6 = local_1079 == 0x24 || local_1079 == 0x26;
      local_107d = local_10c6;
      local_10c7 = local_107a == (VirtReg)0x22 || local_107a == (VirtReg)0x24;
      local_107e = local_10c7;
      local_f90._arch = local_1048[0x10];
      local_f90._subArch = local_1048[0x11];
      local_f90._vendor = local_1048[0x12];
      local_f90._platform = local_1048[0x13];
      local_f90._platformABI = local_1048[0x14];
      local_f90._objectFormat = local_1048[0x15];
      local_f90._floatABI = local_1048[0x16];
      local_f90._reserved = local_1048[0x17];
      local_d3c = *(uint *)(local_1048._16_8_ + 4);
      local_d38 = &local_1068;
      local_d40 = 0x1000019;
      local_268 = &local_d40;
      local_1068 = 0x1000019;
      bVar1 = false;
      if (local_10c6) {
        bVar1 = local_10c7;
      }
      local_1078 = 0x1de;
      local_260 = local_d38;
      local_124 = local_d3c;
      local_120 = local_d38;
      local_1064 = local_d3c;
      if (bVar1) {
        local_1078 = 0x1da;
      }
      goto LAB_001f1451;
    }
  case 0x22:
  case 0x23:
    local_77a = 0x20;
    local_77b = 0x29;
    local_780 = (uint)(byte)local_107a;
    local_784 = 0x20;
    local_788 = 0x29;
    local_470 = &local_780;
    local_478 = &local_784;
    local_480 = &local_788;
    local_10c9 = 0x1f < local_780 && local_780 < 0x2a;
    local_c81 = local_107a;
    local_779 = local_107a;
    if (local_10c9) {
      local_e80 = local_1048;
      local_e84 = 4;
      local_8e4 = 4;
      local_1048[3] = 4;
      local_fe0._arch = local_1048[0x10];
      local_fe0._subArch = local_1048[0x11];
      local_fe0._vendor = local_1048[0x12];
      local_fe0._platform = local_1048[0x13];
      local_fe0._platformABI = local_1048[0x14];
      local_fe0._objectFormat = local_1048[0x15];
      local_fe0._floatABI = local_1048[0x16];
      local_fe0._reserved = local_1048[0x17];
      local_cdc = *(uint *)(local_1048._16_8_ + 4);
      local_cd8 = &local_1058;
      local_ce0 = 0x4000031;
      local_2b8 = &local_ce0;
      local_1058 = 0x4000031;
      local_b58 = in_RDI[1];
      local_b5c = 0x1b7;
      local_b68 = local_1048;
      local_b70 = local_cd8;
      local_8e0 = local_e80;
      local_3b8 = local_b68;
      local_2b0 = local_cd8;
      local_174 = local_cdc;
      local_170 = local_cd8;
      local_b8 = local_cd8;
      local_1054 = local_cdc;
      EVar2 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
      return EVar2;
    }
    local_6fa = 0x31;
    local_6fb = 0x32;
    local_700 = (uint)(byte)local_107a;
    local_704 = 0x31;
    local_708 = 0x32;
    local_530 = &local_700;
    local_538 = &local_704;
    local_540 = &local_708;
    local_10ca = 0x30 < local_700 && local_700 < 0x33;
    local_c89 = local_107a;
    local_6f9 = local_107a;
    if (local_10ca) {
      local_ea0 = local_1048;
      local_ea4 = 4;
      local_8c4 = 4;
      local_1048._0_4_ = local_1048._0_4_ & 0xffffff | 0x4000000;
      local_ff0._arch = local_1048[0x10];
      local_ff0._subArch = local_1048[0x11];
      local_ff0._vendor = local_1048[0x12];
      local_ff0._platform = local_1048[0x13];
      local_ff0._platformABI = local_1048[0x14];
      local_ff0._objectFormat = local_1048[0x15];
      local_ff0._floatABI = local_1048[0x16];
      local_ff0._reserved = local_1048[0x17];
      local_a0c = *(uint *)(local_1048._16_8_ + 4);
      local_a08 = &local_1058;
      local_a10 = 0x8000391;
      local_388 = &local_a10;
      local_1058 = 0x8000391;
      local_b98 = in_RDI[1];
      local_df4 = 0x1bc;
      local_df8 = 0x4aa;
      if ((*(byte *)((long)in_RDI + 0x292) & 1) == 0) {
        local_1164 = 0x1bc;
      }
      else {
        local_1164 = 0x4aa;
      }
      local_b9c = local_1164;
      local_ba8 = local_1048;
      local_bb0 = &local_1058;
      local_8c0 = local_ea0;
      local_3a8 = local_ba8;
      local_380 = local_a08;
      local_244 = local_a0c;
      local_240 = local_a08;
      local_a8 = local_bb0;
      local_1054 = local_a0c;
      EVar2 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
      return EVar2;
    }
    local_75a = 0x33;
    local_75b = 100;
    local_760 = (uint)(byte)local_107a;
    local_764 = 0x33;
    local_768 = 100;
    local_4a0 = &local_760;
    local_4a8 = &local_764;
    local_4b0 = &local_768;
    local_10cb = 0x32 < local_760 && local_760 < 0x65;
    local_c83 = local_107a;
    local_759 = local_107a;
    if (local_10cb) {
LAB_001f28d0:
      local_ec0 = local_1048;
      local_ec4 = 4;
      local_8a4 = 4;
      local_1048._0_4_ = local_1048._0_4_ & 0xffffff | 0x4000000;
      local_1000._arch = local_1048[0x10];
      local_1000._subArch = local_1048[0x11];
      local_1000._vendor = local_1048[0x12];
      local_1000._platform = local_1048[0x13];
      local_1000._platformABI = local_1048[0x14];
      local_1000._objectFormat = local_1048[0x15];
      local_1000._floatABI = local_1048[0x16];
      local_1000._reserved = local_1048[0x17];
      local_c5c = *(uint *)(local_1048._16_8_ + 4);
      local_c58 = &local_1058;
      local_c60 = 0x10000161;
      local_318 = &local_c60;
      local_1058 = 0x10000161;
      local_bd8 = in_RDI[1];
      local_e14 = 0x1d9;
      local_e18 = 0x4c5;
      if ((*(byte *)((long)in_RDI + 0x292) & 1) == 0) {
        local_1194 = 0x1d9;
      }
      else {
        local_1194 = 0x4c5;
      }
      local_bdc = local_1194;
      local_be8 = local_1048;
      local_bf0 = &local_1058;
      local_8a0 = local_ec0;
      local_398 = local_be8;
      local_310 = local_c58;
      local_1d4 = local_c5c;
      local_1d0 = local_c58;
      local_98 = local_bf0;
      local_1054 = local_c5c;
      EVar2 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
      return EVar2;
    }
LAB_001f143b:
    EVar2 = DebugUtils::errored(0x19);
    return EVar2;
  case 0x28:
  case 0x29:
    local_66a = 0x22;
    local_66b = 0x23;
    local_670 = (uint)(byte)local_107a;
    local_674 = 0x22;
    local_678 = 0x23;
    local_608 = &local_670;
    local_610 = &local_674;
    local_618 = &local_678;
    local_10b9 = local_670 < 0x22 || 0x23 < local_670;
    local_d51 = local_107a;
    local_669 = local_107a;
    if (local_10b9) {
      local_69a = 0x24;
      local_69b = 0x25;
      local_6a0 = (uint)(byte)local_107a;
      local_6a4 = 0x24;
      local_6a8 = 0x25;
      local_5c0 = &local_6a0;
      local_5c8 = &local_6a4;
      local_5d0 = &local_6a8;
      local_10bb = local_6a0 < 0x24 || 0x25 < local_6a0;
      local_d19 = local_107a;
      local_699 = local_107a;
      if (local_10bb) {
        local_6ba = 0x26;
        local_6bb = 0x27;
        local_6c0 = (uint)(byte)local_107a;
        local_6c4 = 0x26;
        local_6c8 = 0x27;
        local_590 = &local_6c0;
        local_598 = &local_6c4;
        local_5a0 = &local_6c8;
        local_ce1 = local_107a;
        local_6b9 = local_107a;
        if (local_6c0 < 0x26 || 0x27 < local_6c0) {
          local_6da = 0x28;
          local_6db = 0x29;
          local_6e0 = (uint)(byte)local_107a;
          local_6e4 = 0x28;
          local_6e8 = 0x29;
          local_560 = &local_6e0;
          local_568 = &local_6e4;
          local_570 = &local_6e8;
          local_10be = 0x27 < local_6e0 && local_6e0 < 0x2a;
          local_c8b = local_107a;
          local_6d9 = local_107a;
          if (local_10be) {
LAB_001f22c0:
            local_e90 = local_1048;
            local_e94 = 8;
            local_8d4 = 8;
            local_1048[3] = 8;
            local_fe8._arch = local_1048[0x10];
            local_fe8._subArch = local_1048[0x11];
            local_fe8._vendor = local_1048[0x12];
            local_fe8._platform = local_1048[0x13];
            local_fe8._platformABI = local_1048[0x14];
            local_fe8._objectFormat = local_1048[0x15];
            local_fe8._floatABI = local_1048[0x16];
            local_fe8._reserved = local_1048[0x17];
            local_a6c = *(uint *)(local_1048._16_8_ + 4);
            local_b90 = &local_1058;
            local_a70 = 0x8000039;
            local_358 = &local_a70;
            local_1058 = 0x8000039;
            local_b78 = in_RDI[1];
            local_b7c = 0x1b7;
            local_b88 = local_1048;
            local_a68 = local_b90;
            local_8d0 = local_e90;
            local_3b0 = local_b88;
            local_350 = local_b90;
            local_214 = local_a6c;
            local_210 = local_b90;
            local_b0 = local_b90;
            local_1054 = local_a6c;
            EVar2 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                        (Operand_ *)
                                        CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50
                                                ),
                                        (Operand_ *)
                                        CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48
                                                ));
            return EVar2;
          }
          local_70a = 0x31;
          local_70b = 0x32;
          local_710 = (uint)(byte)local_107a;
          local_714 = 0x31;
          local_718 = 0x32;
          local_518 = &local_710;
          local_520 = &local_714;
          local_528 = &local_718;
          local_10bf = 0x30 < local_710 && local_710 < 0x33;
          local_c88 = local_107a;
          local_709 = local_107a;
          if (local_10bf) {
LAB_001f26a9:
            local_eb0 = local_1048;
            local_eb4 = 8;
            local_8b4 = 8;
            local_1048._0_4_ = local_1048._0_4_ & 0xffffff | 0x8000000;
            local_ff8._arch = local_1048[0x10];
            local_ff8._subArch = local_1048[0x11];
            local_ff8._vendor = local_1048[0x12];
            local_ff8._platform = local_1048[0x13];
            local_ff8._platformABI = local_1048[0x14];
            local_ff8._objectFormat = local_1048[0x15];
            local_ff8._floatABI = local_1048[0x16];
            local_ff8._reserved = local_1048[0x17];
            local_a1c = *(uint *)(local_1048._16_8_ + 4);
            local_a18 = &local_1058;
            local_a20 = 0x8000391;
            local_378 = &local_a20;
            local_1058 = 0x8000391;
            local_bb8 = in_RDI[1];
            local_e04 = 0x1d3;
            local_e08 = 0x4c0;
            if ((*(byte *)((long)in_RDI + 0x292) & 1) == 0) {
              local_117c = 0x1d3;
            }
            else {
              local_117c = 0x4c0;
            }
            local_bbc = local_117c;
            local_bc8 = local_1048;
            local_bd0 = &local_1058;
            local_8b0 = local_eb0;
            local_3a0 = local_bc8;
            local_370 = local_a18;
            local_234 = local_a1c;
            local_230 = local_a18;
            local_a0 = local_bd0;
            local_1054 = local_a1c;
            EVar2 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                        (Operand_ *)
                                        CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50
                                                ),
                                        (Operand_ *)
                                        CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48
                                                ));
            return EVar2;
          }
          local_76a = 0x33;
          local_76b = 100;
          local_770 = (uint)(byte)local_107a;
          local_774 = 0x33;
          local_778 = 100;
          local_488 = &local_770;
          local_490 = &local_774;
          local_498 = &local_778;
          local_10c0 = 0x32 < local_770 && local_770 < 0x65;
          local_c82 = local_107a;
          local_769 = local_107a;
          if (local_10c0) goto LAB_001f2af7;
          goto LAB_001f143b;
        }
        local_f80._arch = local_1048[0x10];
        local_f80._subArch = local_1048[0x11];
        local_f80._vendor = local_1048[0x12];
        local_f80._platform = local_1048[0x13];
        local_f80._platformABI = local_1048[0x14];
        local_f80._objectFormat = local_1048[0x15];
        local_f80._floatABI = local_1048[0x16];
        local_f80._reserved = local_1048[0x17];
        local_c9c = *(uint *)(local_1048._16_8_ + 4);
        local_c98 = &local_1068;
        local_ca0 = 0x4000031;
        local_2f8 = &local_ca0;
        local_1068 = 0x4000031;
        local_1078 = 0x1db;
        local_2f0 = local_c98;
        local_1b4 = local_c9c;
        local_1b0 = local_c98;
        local_1064 = local_c9c;
        if ((local_1079 != 0x28) || (local_107a != (VirtReg)0x26)) {
          local_e70 = local_1048;
          local_e74 = 4;
          local_8f4 = 4;
          local_1048._0_4_ = local_1048._0_4_ & 0xffffff | 0x4000000;
          local_fd8._arch = local_1048[0x10];
          local_fd8._subArch = local_1048[0x11];
          local_fd8._vendor = local_1048[0x12];
          local_fd8._platform = local_1048[0x13];
          local_fd8._platformABI = local_1048[0x14];
          local_fd8._objectFormat = local_1048[0x15];
          local_fd8._floatABI = local_1048[0x16];
          local_fd8._reserved = local_1048[0x17];
          local_ccc = *(uint *)(local_1048._16_8_ + 4);
          local_cc8 = &local_1058;
          local_cd0 = 0x4000031;
          local_2c8 = &local_cd0;
          local_1058 = 0x4000031;
          local_8f0 = local_e70;
          local_2c0 = local_cc8;
          local_184 = local_ccc;
          local_180 = local_cc8;
          local_1054 = local_ccc;
          break;
        }
      }
      else {
        local_f78._arch = local_1048[0x10];
        local_f78._subArch = local_1048[0x11];
        local_f78._vendor = local_1048[0x12];
        local_f78._platform = local_1048[0x13];
        local_f78._platformABI = local_1048[0x14];
        local_f78._objectFormat = local_1048[0x15];
        local_f78._floatABI = local_1048[0x16];
        local_f78._reserved = local_1048[0x17];
        local_cf4 = *(uint *)(local_1048._16_8_ + 4);
        local_cf0 = &local_1068;
        local_cf8 = 0x2000029;
        local_2a8 = &local_cf8;
        local_1068 = 0x2000029;
        local_1078 = 0x1de;
        local_2a0 = local_cf0;
        local_164 = local_cf4;
        local_160 = local_cf0;
        local_1064 = local_cf4;
        if (local_1079 == 0x28 && local_107a == (VirtReg)0x24) {
          local_1078 = 0x1da;
        }
      }
    }
    else {
      local_f70._arch = local_1048[0x10];
      local_f70._subArch = local_1048[0x11];
      local_f70._vendor = local_1048[0x12];
      local_f70._platform = local_1048[0x13];
      local_f70._platformABI = local_1048[0x14];
      local_f70._objectFormat = local_1048[0x15];
      local_f70._floatABI = local_1048[0x16];
      local_f70._reserved = local_1048[0x17];
      local_d2c = *(uint *)(local_1048._16_8_ + 4);
      local_d28 = &local_1068;
      local_d30 = 0x1000019;
      local_278 = &local_d30;
      local_1068 = 0x1000019;
      local_1078 = 0x1de;
      local_270 = local_d28;
      local_134 = local_d2c;
      local_130 = local_d28;
      local_1064 = local_d2c;
      if (local_1079 == 0x28 && local_107a == (VirtReg)0x22) {
        local_1078 = 0x1da;
      }
    }
LAB_001f1747:
    if (local_1074 == 8) {
      local_e50 = local_1048;
      local_e54 = 8;
      local_914 = 8;
      local_1048._0_4_ = local_1048._0_4_ & 0xffffff | 0x8000000;
      local_fc8._arch = local_1048[0x10];
      local_fc8._subArch = local_1048[0x11];
      local_fc8._vendor = local_1048[0x12];
      local_fc8._platform = local_1048[0x13];
      local_fc8._platformABI = local_1048[0x14];
      local_fc8._objectFormat = local_1048[0x15];
      local_fc8._floatABI = local_1048[0x16];
      local_fc8._reserved = local_1048[0x17];
      local_a5c = *(uint *)(local_1048._16_8_ + 4);
      local_a58 = &local_1058;
      local_a60 = 0x8000039;
      local_368 = &local_a60;
      local_1058 = 0x8000039;
      local_a98 = in_RDI[1];
      local_a9c = local_1078;
      local_aa8 = &local_1058;
      local_ab0 = &local_1068;
      local_910 = local_e50;
      local_360 = local_a58;
      local_224 = local_a5c;
      local_220 = local_a58;
      local_f8 = local_ab0;
      local_f0 = local_aa8;
      local_1054 = local_a5c;
      local_1090 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                       (Operand_ *)
                                       CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50)
                                       ,(Operand_ *)
                                        CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48
                                                ));
      if (local_1090 != 0) {
        return local_1090;
      }
      local_b18 = in_RDI[1];
      local_b1c = 0x1b7;
      local_b28 = local_1048;
      local_b30 = &local_1058;
      local_3c8 = local_b28;
      local_c8 = local_b30;
      EVar2 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
      goto joined_r0x001f1f95;
    }
    local_e60 = local_1048;
    local_e64 = 4;
    local_904 = 4;
    local_1048._0_4_ = local_1048._0_4_ & 0xffffff | 0x4000000;
    local_fd0._arch = local_1048[0x10];
    local_fd0._subArch = local_1048[0x11];
    local_fd0._vendor = local_1048[0x12];
    local_fd0._platform = local_1048[0x13];
    local_fd0._platformABI = local_1048[0x14];
    local_fd0._objectFormat = local_1048[0x15];
    local_fd0._floatABI = local_1048[0x16];
    local_fd0._reserved = local_1048[0x17];
    local_cbc = *(uint *)(local_1048._16_8_ + 4);
    local_cb8 = &local_1058;
    local_cc0 = 0x4000031;
    local_2d8 = &local_cc0;
    local_1058 = 0x4000031;
    local_ab8 = in_RDI[1];
    local_abc = local_1078;
    local_ac8 = &local_1058;
    local_ad0 = &local_1068;
    local_900 = local_e60;
    local_2d0 = local_cb8;
    local_194 = local_cbc;
    local_190 = local_cb8;
    local_e8 = local_ad0;
    local_e0 = local_ac8;
    local_1054 = local_cbc;
    EVar2 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                (Operand_ *)
                                CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                                (Operand_ *)
                                CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
    if (EVar2 != 0) {
      return EVar2;
    }
    local_1098 = 0;
    break;
  case 0x2a:
  case 0x3b:
    local_73a = 0x33;
    local_73b = 100;
    local_740 = (uint)(byte)local_107a;
    local_744 = 0x33;
    local_748 = 100;
    local_4d0 = &local_740;
    local_4d8 = &local_744;
    local_4e0 = &local_748;
    local_c85 = local_107a;
    local_739 = local_107a;
    if (local_740 < 0x33 || 100 < local_740) goto LAB_001f143b;
    goto LAB_001f28d0;
  case 0x2b:
  case 0x46:
    local_72a = 0x33;
    local_72b = 100;
    local_730 = (uint)(byte)local_107a;
    local_734 = 0x33;
    local_738 = 100;
    local_4e8 = &local_730;
    local_4f0 = &local_734;
    local_4f8 = &local_738;
    local_10d3 = 0x32 < local_730 && local_730 < 0x65;
    local_c86 = local_107a;
    local_729 = local_107a;
    if (local_10d3) {
LAB_001f2af7:
      local_ed0 = (BaseEmitter *)local_1048;
      local_ed4 = 8;
      local_894 = 8;
      local_1048._0_4_ = local_1048._0_4_ & 0xffffff | 0x8000000;
      local_1008._arch = local_1048[0x10];
      local_1008._subArch = local_1048[0x11];
      local_1008._vendor = local_1048[0x12];
      local_1008._platform = local_1048[0x13];
      local_1008._platformABI = local_1048[0x14];
      local_1008._objectFormat = local_1048[0x15];
      local_1008._floatABI = local_1048[0x16];
      local_1008._reserved = local_1048[0x17];
      local_c6c = *(uint *)(local_1048._16_8_ + 4);
      local_c68 = &local_1058;
      local_c70 = 0x10000161;
      local_308 = &local_c70;
      local_1058 = 0x10000161;
      local_bf8 = in_RDI[1];
      local_e24 = 0x1c8;
      local_e28 = 0x4b9;
      if ((*(byte *)((long)in_RDI + 0x292) & 1) == 0) {
        local_bfc = 0x1c8;
      }
      else {
        local_bfc = 0x4b9;
      }
      local_c08 = local_1048;
      local_c10 = &local_1058;
      local_890 = local_ed0;
      local_390 = local_c08;
      local_300 = local_c68;
      local_1c4 = local_c6c;
      local_1c0 = local_c68;
      local_90 = local_c10;
      local_1054 = local_c6c;
      EVar2 = BaseEmitter::_emitI(local_ed0,(InstId)((ulong)local_bf8 >> 0x20),
                                  (Operand_ *)CONCAT44(local_bfc,in_stack_ffffffffffffee50),
                                  (Operand_ *)
                                  CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
      return EVar2;
    }
    goto LAB_001f143b;
  default:
    local_71a = 0x33;
    local_71b = 100;
    local_720 = (uint)local_1079;
    local_724 = 0x33;
    local_728 = 100;
    local_500 = &local_720;
    local_508 = &local_724;
    local_510 = &local_728;
    local_10d4 = 0x32 < local_720 && local_720 < 0x65;
    local_c87 = local_1079;
    local_719 = local_1079;
    if (local_10d4) {
      local_1010._arch = local_1048[0x10];
      local_1010._subArch = local_1048[0x11];
      local_1010._vendor = local_1048[0x12];
      local_1010._platform = local_1048[0x13];
      local_1010._platformABI = local_1048[0x14];
      local_1010._objectFormat = local_1048[0x15];
      local_1010._floatABI = local_1048[0x16];
      local_1010._reserved = local_1048[0x17];
      local_c80._arch = local_1048[0x10];
      local_c80._subArch = local_1048[0x11];
      local_c80._vendor = local_1048[0x12];
      local_c80._platform = local_1048[0x13];
      local_c80._platformABI = local_1048[0x14];
      local_c80._objectFormat = local_1048[0x15];
      local_c80._floatABI = local_1048[0x16];
      local_c80._reserved = local_1048[0x17];
      local_9b0._arch = local_1048[0x10];
      local_9b0._subArch = local_1048[0x11];
      local_9b0._vendor = local_1048[0x12];
      local_9b0._platform = local_1048[0x13];
      local_9b0._platformABI = local_1048[0x14];
      local_9b0._objectFormat = local_1048[0x15];
      local_9b0._floatABI = local_1048[0x16];
      local_9b0._reserved = local_1048[0x17];
      local_9b1 = 1;
      local_9a0._arch = local_1048[0x10];
      local_9a0._subArch = local_1048[0x11];
      local_9a0._vendor = local_1048[0x12];
      local_9a0._platform = local_1048[0x13];
      local_9a0._platformABI = local_1048[0x14];
      local_9a0._objectFormat = local_1048[0x15];
      local_9a0._floatABI = local_1048[0x16];
      local_9a0._reserved = local_1048[0x17];
      local_9a4 = 0xf00;
      local_9b8 = *(uint *)local_1048._16_8_ & 0xf00;
      local_979 = 1;
      local_9bc = 0x100;
      local_988 = &local_9b8;
      local_990 = &local_9bc;
      local_994 = local_9b8;
      local_978 = local_9bc;
      if (local_9b8 == 0x100) {
        local_e30 = local_1048;
        local_e34 = (uint)(byte)TypeUtils::_typeData[(ulong)local_1079 + 0x100];
        local_1048._0_4_ = local_1048._0_4_ & 0xffffff | local_e34 << 0x18;
        local_de4 = 0x1ba;
        local_de8 = 0x4a9;
        if ((*(byte *)((long)in_RDI + 0x292) & 1) == 0) {
          local_10e4 = 0x1ba;
        }
        else {
          local_10e4 = 0x4a9;
        }
        local_1084 = local_10e4;
        local_78a = 0x47;
        local_78b = 0x50;
        local_790 = (uint)local_1079;
        local_794 = 0x47;
        local_798 = 0x50;
        local_458 = &local_790;
        local_460 = &local_794;
        local_468 = &local_798;
        local_10e5 = local_790 < 0x47 || 0x50 < local_790;
        local_dcd = local_1079;
        local_c71 = local_1079;
        local_934 = local_e34;
        local_930 = local_e30;
        local_789 = local_1079;
        if (local_10e5) {
          local_79a = 0x51;
          local_79b = 0x5a;
          local_7a0 = (uint)local_1079;
          local_7a4 = 0x51;
          local_7a8 = 0x5a;
          local_440 = &local_7a0;
          local_448 = &local_7a4;
          local_450 = &local_7a8;
          local_10e6 = local_7a0 < 0x51 || 0x5a < local_7a0;
          local_c39 = local_1079;
          local_799 = local_1079;
          if (local_10e6) {
            local_7aa = 0x5b;
            local_7ab = 100;
            local_7b0 = (uint)local_1079;
            local_7b4 = 0x5b;
            local_7b8 = 100;
            local_428 = &local_7b0;
            local_430 = &local_7b4;
            local_438 = &local_7b8;
            local_c21 = local_1079;
            local_7a9 = local_1079;
            if (local_7b0 < 0x5b || 100 < local_7b0) goto LAB_001f143b;
            local_fb8._arch = local_1048[0x10];
            local_fb8._subArch = local_1048[0x11];
            local_fb8._vendor = local_1048[0x12];
            local_fb8._platform = local_1048[0x13];
            local_fb8._platformABI = local_1048[0x14];
            local_fb8._objectFormat = local_1048[0x15];
            local_fb8._floatABI = local_1048[0x16];
            local_fb8._reserved = local_1048[0x17];
            local_c1c = *(uint *)(local_1048._16_8_ + 4);
            local_c18 = &local_1058;
            local_c20 = 0x40000171;
            local_348 = &local_c20;
            local_1058 = 0x40000171;
            local_340 = local_c18;
            local_204 = local_c1c;
            local_200 = local_c18;
            local_1054 = local_c1c;
          }
          else {
            local_fb0._arch = local_1048[0x10];
            local_fb0._subArch = local_1048[0x11];
            local_fb0._vendor = local_1048[0x12];
            local_fb0._platform = local_1048[0x13];
            local_fb0._platformABI = local_1048[0x14];
            local_fb0._objectFormat = local_1048[0x15];
            local_fb0._floatABI = local_1048[0x16];
            local_fb0._reserved = local_1048[0x17];
            local_c34 = *(uint *)(local_1048._16_8_ + 4);
            local_c30 = &local_1058;
            local_c38 = 0x20000169;
            local_338 = &local_c38;
            local_1058 = 0x20000169;
            local_330 = local_c30;
            local_1f4 = local_c34;
            local_1f0 = local_c30;
            local_1054 = local_c34;
          }
        }
        else {
          local_fa8._arch = local_1048[0x10];
          local_fa8._subArch = local_1048[0x11];
          local_fa8._vendor = local_1048[0x12];
          local_fa8._platform = local_1048[0x13];
          local_fa8._platformABI = local_1048[0x14];
          local_fa8._objectFormat = local_1048[0x15];
          local_fa8._floatABI = local_1048[0x16];
          local_fa8._reserved = local_1048[0x17];
          local_c4c = *(uint *)(local_1048._16_8_ + 4);
          local_c48 = &local_1058;
          local_c50 = 0x10000161;
          local_328 = &local_c50;
          local_1058 = 0x10000161;
          local_320 = local_c48;
          local_1e4 = local_c4c;
          local_1e0 = local_c48;
          local_1054 = local_c4c;
        }
        local_ad8 = in_RDI[1];
        local_adc = local_10e4;
        local_ae8 = local_1048;
        local_af0 = &local_1058;
        local_3d8 = local_ae8;
        local_d8 = local_af0;
        EVar2 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                    (Operand_ *)
                                    CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                                    (Operand_ *)
                                    CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
        return EVar2;
      }
    }
    goto LAB_001f143b;
  case 0x31:
  case 0x32:
    local_64a = 0x22;
    local_64b = 0x23;
    local_650 = (uint)(byte)local_107a;
    local_654 = 0x22;
    local_658 = 0x23;
    local_638 = &local_650;
    local_640 = &local_654;
    local_648 = &local_658;
    local_10cc = 0x21 < local_650 && local_650 < 0x24;
    local_d53 = local_107a;
    local_649 = local_107a;
    if (local_10cc) {
      local_f98._arch = local_1048[0x10];
      local_f98._subArch = local_1048[0x11];
      local_f98._vendor = local_1048[0x12];
      local_f98._platform = local_1048[0x13];
      local_f98._platformABI = local_1048[0x14];
      local_f98._objectFormat = local_1048[0x15];
      local_f98._floatABI = local_1048[0x16];
      local_f98._reserved = local_1048[0x17];
      local_d4c = *(uint *)(local_1048._16_8_ + 4);
      local_d48 = &local_1068;
      local_d50 = 0x1000019;
      local_258 = &local_d50;
      local_1068 = 0x1000019;
      local_1078 = 0x1de;
      local_250 = local_d48;
      local_114 = local_d4c;
      local_110 = local_d48;
      local_1064 = local_d4c;
      goto LAB_001f1747;
    }
    local_67a = 0x24;
    local_67b = 0x25;
    local_680 = (uint)(byte)local_107a;
    local_684 = 0x24;
    local_688 = 0x25;
    local_5f0 = &local_680;
    local_5f8 = &local_684;
    local_600 = &local_688;
    local_10cd = 0x23 < local_680 && local_680 < 0x26;
    local_d1b = local_107a;
    local_679 = local_107a;
    if (local_10cd) {
      local_fa0._arch = local_1048[0x10];
      local_fa0._subArch = local_1048[0x11];
      local_fa0._vendor = local_1048[0x12];
      local_fa0._platform = local_1048[0x13];
      local_fa0._platformABI = local_1048[0x14];
      local_fa0._objectFormat = local_1048[0x15];
      local_fa0._floatABI = local_1048[0x16];
      local_fa0._reserved = local_1048[0x17];
      local_d14 = *(uint *)(local_1048._16_8_ + 4);
      local_d10 = &local_1068;
      local_d18 = 0x2000029;
      local_288 = &local_d18;
      local_1068 = 0x2000029;
      local_1078 = 0x1de;
      local_280 = local_d10;
      local_144 = local_d14;
      local_140 = local_d10;
      local_1064 = local_d14;
      goto LAB_001f1747;
    }
    local_6aa = 0x26;
    local_6ab = 0x27;
    local_6b0 = (uint)(byte)local_107a;
    local_6b4 = 0x26;
    local_6b8 = 0x27;
    local_5a8 = &local_6b0;
    local_5b0 = &local_6b4;
    local_5b8 = &local_6b8;
    local_ce2 = local_107a;
    local_6a9 = local_107a;
    if (local_6b0 < 0x26 || 0x27 < local_6b0) {
      local_6ca = 0x28;
      local_6cb = 0x29;
      local_6d0 = (uint)(byte)local_107a;
      local_6d4 = 0x28;
      local_6d8 = 0x29;
      local_578 = &local_6d0;
      local_580 = &local_6d4;
      local_588 = &local_6d8;
      local_10cf = 0x27 < local_6d0 && local_6d0 < 0x2a;
      local_c8c = local_107a;
      local_6c9 = local_107a;
      if (local_10cf) goto LAB_001f22c0;
      local_6ea = 0x31;
      local_6eb = 0x32;
      local_6f0 = (uint)(byte)local_107a;
      local_6f4 = 0x31;
      local_6f8 = 0x32;
      local_548 = &local_6f0;
      local_550 = &local_6f4;
      local_558 = &local_6f8;
      local_10d0 = 0x30 < local_6f0 && local_6f0 < 0x33;
      local_c8a = local_107a;
      local_6e9 = local_107a;
      if (local_10d0) goto LAB_001f26a9;
      local_74a = 0x33;
      local_74b = 100;
      local_750 = (uint)(byte)local_107a;
      local_754 = 0x33;
      local_758 = 100;
      local_4b8 = &local_750;
      local_4c0 = &local_754;
      local_4c8 = &local_758;
      local_10d1 = 0x32 < local_750 && local_750 < 0x65;
      local_c84 = local_107a;
      local_749 = local_107a;
      if (local_10d1) goto LAB_001f2af7;
      goto LAB_001f143b;
    }
  }
  local_b38 = in_RDI[1];
  local_b3c = 0x1b7;
  local_b48 = local_1048;
  local_b50 = &local_1058;
  local_3c0 = local_b48;
  local_c0 = local_b50;
  local_109c = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                                   (Operand_ *)
                                   CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                                   (Operand_ *)
                                   CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
  if (local_109c != 0) {
    return local_109c;
  }
  local_1048._12_4_ = local_1048._12_4_ + 4;
  local_a28 = in_RDI[1];
  local_10a4[0] = 0;
  local_a2c = 0x17;
  local_a38 = local_1048;
  local_a40 = local_10a4;
  local_80 = &local_a50;
  local_6c = 0;
  local_54 = 4;
  local_50 = 4;
  local_74 = 4;
  local_18 = 0;
  local_78 = 0;
  local_28 = &local_74;
  local_30 = &local_78;
  local_70 = 4;
  local_48 = 0;
  local_10 = 0;
  local_8 = 0;
  local_40 = &local_70;
  local_44 = 0;
  local_4c = 0;
  local_a50 = 4;
  local_a4c = 0;
  local_a48 = 0;
  local_a44 = 0;
  local_3e0 = local_a38;
  local_88 = local_a40;
  local_68 = local_a40;
  local_60 = local_80;
  local_38 = local_80;
  local_1c = local_70;
  local_14 = local_78;
  EVar2 = BaseEmitter::_emitI(in_stack_ffffffffffffee60,instId_00,
                              (Operand_ *)
                              CONCAT44(in_stack_ffffffffffffee54,in_stack_ffffffffffffee50),
                              (Operand_ *)
                              CONCAT44(in_stack_ffffffffffffee4c,in_stack_ffffffffffffee48));
joined_r0x001f1f95:
  if (EVar2 != 0) {
    return EVar2;
  }
  return 0;
}

Assistant:

Error RACFGBuilder::moveRegToStackArg(InvokeNode* invokeNode, const FuncValue& arg, const BaseReg& reg) noexcept {
  DebugUtils::unused(invokeNode);
  ASMJIT_ASSERT(arg.isStack());

  Mem stackPtr = ptr(_pass->_sp.as<Gp>(), arg.stackOffset());
  Reg r0, r1;

  VirtReg* vr = cc()->virtRegById(reg.id());
  uint32_t registerSize = cc()->registerSize();
  InstId instId = 0;

  TypeId dstTypeId = arg.typeId();
  TypeId srcTypeId = vr->typeId();

  switch (dstTypeId) {
    case TypeId::kInt64:
    case TypeId::kUInt64:
      // Extend BYTE->QWORD (GP).
      if (TypeUtils::isGp8(srcTypeId)) {
        r1.setRegT<RegType::kX86_GpbLo>(reg.id());

        instId = (dstTypeId == TypeId::kInt64 && srcTypeId == TypeId::kInt8) ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      // Extend WORD->QWORD (GP).
      if (TypeUtils::isGp16(srcTypeId)) {
        r1.setRegT<RegType::kX86_Gpw>(reg.id());

        instId = (dstTypeId == TypeId::kInt64 && srcTypeId == TypeId::kInt16) ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      // Extend DWORD->QWORD (GP).
      if (TypeUtils::isGp32(srcTypeId)) {
        r1.setRegT<RegType::kX86_Gpd>(reg.id());

        instId = Inst::kIdMovsxd;
        if (dstTypeId == TypeId::kInt64 && srcTypeId == TypeId::kInt32)
          goto ExtendMovGpXQ;
        else
          goto ZeroExtendGpDQ;
      }

      // Move QWORD (GP).
      if (TypeUtils::isGp64(srcTypeId)) goto MovGpQ;
      if (TypeUtils::isMmx(srcTypeId)) goto MovMmQ;
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmQ;
      break;

    case TypeId::kInt32:
    case TypeId::kUInt32:
    case TypeId::kInt16:
    case TypeId::kUInt16:
      // DWORD <- WORD (Zero|Sign Extend).
      if (TypeUtils::isGp16(srcTypeId)) {
        bool isDstSigned = dstTypeId == TypeId::kInt16 || dstTypeId == TypeId::kInt32;
        bool isSrcSigned = srcTypeId == TypeId::kInt8  || srcTypeId == TypeId::kInt16;

        r1.setRegT<RegType::kX86_Gpw>(reg.id());
        instId = isDstSigned && isSrcSigned ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpD;
      }

      // DWORD <- BYTE (Zero|Sign Extend).
      if (TypeUtils::isGp8(srcTypeId)) {
        bool isDstSigned = dstTypeId == TypeId::kInt16 || dstTypeId == TypeId::kInt32;
        bool isSrcSigned = srcTypeId == TypeId::kInt8  || srcTypeId == TypeId::kInt16;

        r1.setRegT<RegType::kX86_GpbLo>(reg.id());
        instId = isDstSigned && isSrcSigned ? Inst::kIdMovsx : Inst::kIdMovzx;
        goto ExtendMovGpD;
      }
      ASMJIT_FALLTHROUGH;

    case TypeId::kInt8:
    case TypeId::kUInt8:
      if (TypeUtils::isInt(srcTypeId)) goto MovGpD;
      if (TypeUtils::isMmx(srcTypeId)) goto MovMmD;
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmD;
      break;

    case TypeId::kMmx32:
    case TypeId::kMmx64:
      // Extend BYTE->QWORD (GP).
      if (TypeUtils::isGp8(srcTypeId)) {
        r1.setRegT<RegType::kX86_GpbLo>(reg.id());

        instId = Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      // Extend WORD->QWORD (GP).
      if (TypeUtils::isGp16(srcTypeId)) {
        r1.setRegT<RegType::kX86_Gpw>(reg.id());

        instId = Inst::kIdMovzx;
        goto ExtendMovGpXQ;
      }

      if (TypeUtils::isGp32(srcTypeId)) goto ExtendMovGpDQ;
      if (TypeUtils::isGp64(srcTypeId)) goto MovGpQ;
      if (TypeUtils::isMmx(srcTypeId)) goto MovMmQ;
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmQ;
      break;

    case TypeId::kFloat32:
    case TypeId::kFloat32x1:
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmD;
      break;

    case TypeId::kFloat64:
    case TypeId::kFloat64x1:
      if (TypeUtils::isVec(srcTypeId)) goto MovXmmQ;
      break;

    default:
      if (TypeUtils::isVec(dstTypeId) && reg.as<Reg>().isVec()) {
        stackPtr.setSize(TypeUtils::sizeOf(dstTypeId));
        uint32_t vMovInstId = choose(Inst::kIdMovaps, Inst::kIdVmovaps);

        if (TypeUtils::isVec128(dstTypeId))
          r0.setRegT<RegType::kX86_Xmm>(reg.id());
        else if (TypeUtils::isVec256(dstTypeId))
          r0.setRegT<RegType::kX86_Ymm>(reg.id());
        else if (TypeUtils::isVec512(dstTypeId))
          r0.setRegT<RegType::kX86_Zmm>(reg.id());
        else
          break;

        return cc()->emit(vMovInstId, stackPtr, r0);
      }
      break;
  }
  return DebugUtils::errored(kErrorInvalidAssignment);

  // Extend+Move Gp.
ExtendMovGpD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Gpd>(reg.id());

  ASMJIT_PROPAGATE(cc()->emit(instId, r0, r1));
  ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, stackPtr, r0));
  return kErrorOk;

ExtendMovGpXQ:
  if (registerSize == 8) {
    stackPtr.setSize(8);
    r0.setRegT<RegType::kX86_Gpq>(reg.id());

    ASMJIT_PROPAGATE(cc()->emit(instId, r0, r1));
    ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, stackPtr, r0));
  }
  else {
    stackPtr.setSize(4);
    r0.setRegT<RegType::kX86_Gpd>(reg.id());

    ASMJIT_PROPAGATE(cc()->emit(instId, r0, r1));

ExtendMovGpDQ:
    ASMJIT_PROPAGATE(cc()->emit(Inst::kIdMov, stackPtr, r0));
    stackPtr.addOffsetLo32(4);
    ASMJIT_PROPAGATE(cc()->emit(Inst::kIdAnd, stackPtr, 0));
  }
  return kErrorOk;

ZeroExtendGpDQ:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Gpd>(reg.id());
  goto ExtendMovGpDQ;

MovGpD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Gpd>(reg.id());
  return cc()->emit(Inst::kIdMov, stackPtr, r0);

MovGpQ:
  stackPtr.setSize(8);
  r0.setRegT<RegType::kX86_Gpq>(reg.id());
  return cc()->emit(Inst::kIdMov, stackPtr, r0);

MovMmD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Mm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovd, Inst::kIdVmovd), stackPtr, r0);

MovMmQ:
  stackPtr.setSize(8);
  r0.setRegT<RegType::kX86_Mm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovq, Inst::kIdVmovq), stackPtr, r0);

MovXmmD:
  stackPtr.setSize(4);
  r0.setRegT<RegType::kX86_Xmm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), stackPtr, r0);

MovXmmQ:
  stackPtr.setSize(8);
  r0.setRegT<RegType::kX86_Xmm>(reg.id());
  return cc()->emit(choose(Inst::kIdMovlps, Inst::kIdVmovlps), stackPtr, r0);
}